

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr10r1100sixx.cpp
# Opt level: O3

bool __thiscall
IKSolver::ComputeIk(IKSolver *this,IkReal *eetrans,IkReal *eerot,IkReal *pfree,
                   IkSolutionListBase<double> *solutions)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_var;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  uchar uVar11;
  double *pdVar12;
  uint uVar13;
  undefined8 in_R10;
  undefined4 in_R11D;
  bool bVar14;
  ulong uVar15;
  double dVar16;
  undefined1 auVar18 [16];
  double dVar17;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar22;
  undefined1 auVar21 [16];
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar30;
  undefined4 uVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  double dVar40;
  double dVar41;
  double local_1c0;
  undefined1 local_1b8 [24];
  uint local_1a0;
  uint local_19c;
  undefined1 local_198 [16];
  double local_188 [2];
  double local_178;
  double local_170;
  double local_168;
  uint local_15c;
  undefined1 local_158 [16];
  double local_148;
  undefined8 uStack_140;
  double local_138;
  double dStack_130;
  IkSolutionListBase<double> *local_120;
  double local_118;
  double local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  double local_c8;
  ulong uStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98 [2];
  double local_88 [2];
  double local_78 [2];
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [24];
  
  local_1b8._8_8_ = local_1b8._0_8_;
  this->j0 = NAN;
  this->j1 = NAN;
  this->j2 = NAN;
  this->j3 = NAN;
  this->j4 = NAN;
  this->j5 = NAN;
  this->_ij0[0] = 0xff;
  this->_ij0[1] = 0xff;
  this->_nj0 = 0xff;
  this->_ij1[0] = 0xff;
  *(undefined4 *)(this->_ij1 + 1) = 0xffffffff;
  this->_nj2 = 0xff;
  this->_ij3[0] = 0xff;
  this->_ij3[1] = 0xff;
  this->_nj3 = 0xff;
  this->_ij4[0] = 0xff;
  this->_ij4[1] = 0xff;
  this->_nj4 = 0xff;
  this->_ij5[0] = 0xff;
  *(undefined2 *)(this->_ij5 + 1) = 0xffff;
  (*solutions->_vptr_IkSolutionListBase[5])(solutions);
  dVar16 = *eerot;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar16;
  this->r00 = dVar16;
  dVar20 = eerot[1];
  this->r01 = dVar20;
  local_1b8._0_8_ = eerot[2];
  this->r02 = (IkReal)local_1b8._0_8_;
  local_158._0_8_ = eerot[3];
  this->r10 = (IkReal)local_158._0_8_;
  dVar22 = eerot[4];
  this->r11 = dVar22;
  dVar17 = eerot[5];
  this->r12 = dVar17;
  dVar23 = eerot[6];
  this->r20 = dVar23;
  dVar36 = eerot[7];
  local_198._8_8_ = 0;
  local_198._0_8_ = dVar36;
  this->r21 = dVar36;
  dVar25 = eerot[8];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar25;
  this->r22 = dVar25;
  dVar32 = *eetrans;
  this->px = dVar32;
  dVar33 = eetrans[1];
  this->py = dVar33;
  dVar35 = eetrans[2];
  this->new_r00 = (IkReal)local_1b8._0_8_;
  this->new_r01 = dVar20;
  auVar3 = _DAT_00132040;
  auVar18 = auVar18 ^ _DAT_00132040;
  auVar26._0_8_ = auVar18._0_8_;
  auVar26._8_4_ = auVar18._0_4_;
  auVar26._12_4_ = auVar18._4_4_;
  this->new_r02 = auVar26._0_8_;
  this->r02 = (IkReal)auVar26._8_8_;
  this->new_r10 = -dVar17;
  this->r10 = -dVar17;
  this->new_r11 = -dVar22;
  this->r11 = -dVar22;
  this->new_r12 = (IkReal)local_158._0_8_;
  auVar39 = auVar39 ^ auVar3;
  auVar27._0_8_ = auVar39._0_8_;
  auVar27._8_4_ = auVar39._0_4_;
  auVar27._12_4_ = auVar39._4_4_;
  this->new_r20 = auVar27._0_8_;
  this->r20 = (IkReal)auVar27._8_8_;
  auVar18 = local_198 ^ auVar3;
  auVar28._0_8_ = auVar18._0_8_;
  auVar28._8_4_ = auVar18._0_4_;
  auVar28._12_4_ = auVar18._4_4_;
  this->new_r21 = auVar28._0_8_;
  this->r21 = (IkReal)auVar28._8_8_;
  local_158._8_8_ = 0;
  dVar35 = dVar23 * 0.08 + (0.4 - dVar35);
  dVar32 = dVar16 * -0.08 + dVar32;
  dVar33 = dVar33 * -1.0 + (double)local_158._0_8_ * 0.08;
  this->new_r22 = dVar23;
  this->new_pz = dVar35;
  this->r00 = (IkReal)local_1b8._0_8_;
  this->r01 = dVar20;
  this->r12 = (IkReal)local_158._0_8_;
  this->r22 = dVar23;
  this->pz = dVar35;
  this->new_px = dVar32;
  this->px = dVar32;
  this->new_py = dVar33;
  this->py = dVar33;
  this->npx = (dVar32 * (double)local_1b8._0_8_ - dVar33 * dVar17) - dVar35 * dVar25;
  this->npy = (dVar32 * dVar20 - dVar33 * dVar22) - dVar35 * dVar36;
  this->npz = auVar26._0_8_ * dVar32 + (double)local_158._0_8_ * dVar33 + dVar23 * dVar35;
  this->pp = dVar32 * dVar32 + dVar33 * dVar33 + dVar35 * dVar35;
  this->rxp0_0 = dVar25 * dVar33 - dVar35 * dVar17;
  this->rxp0_1 = auVar27._0_8_ * dVar32 - dVar35 * (double)local_1b8._0_8_;
  this->rxp0_2 = dVar17 * dVar32 + (double)local_1b8._0_8_ * dVar33;
  this->rxp1_0 = dVar36 * dVar33 - dVar35 * dVar22;
  this->rxp1_1 = auVar28._0_8_ * dVar32 - dVar35 * dVar20;
  this->rxp1_2 = dVar22 * dVar32 + dVar20 * dVar33;
  this->rxp2_0 = dVar35 * (double)local_158._0_8_ - dVar33 * dVar23;
  this->rxp2_1 = dVar23 * dVar32 + dVar16 * dVar35;
  this->rxp2_2 = (double)(auVar3._0_8_ ^ local_158._0_8_) * dVar32 - dVar16 * dVar33;
  auVar3._8_8_ = dVar33;
  auVar3._0_8_ = dVar32;
  dVar20 = SUB168(auVar3 & _DAT_00132070,8);
  dVar16 = SUB168(auVar3 & _DAT_00132070,0);
  if ((double)((ulong)(dVar16 + dVar20) & (ulong)DAT_00132070) < 1e-06) goto LAB_001155f3;
  this->_nj0 = '\x02';
  local_120 = solutions;
  if ((NAN(dVar33) || NAN(-dVar32)) || ((dVar16 <= 1e-07 && (dVar20 < 1e-07)))) goto LAB_001155f3;
  dVar16 = atan2(dVar33,-dVar32);
  dVar20 = -dVar16;
  local_178 = dVar20;
  local_78[0] = sin(dVar20);
  local_108._0_8_ = local_78[0];
  local_108._8_8_ = extraout_XMM0_Qb;
  local_68 = cos(dVar20);
  dVar20 = 3.14159265358979 - dVar16;
  local_168 = dVar20;
  local_f8._0_8_ = local_68;
  local_f8._8_8_ = extraout_XMM0_Qb_00;
  local_118 = sin(dVar20);
  local_1b8._0_8_ = local_118;
  local_110 = cos(dVar20);
  if (-3.14159265358979 <= dVar16) {
    if (3.14159265358979 < dVar16) {
      dVar22 = 6.28318530717959;
      goto LAB_001156e8;
    }
  }
  else {
    dVar22 = -6.28318530717959;
LAB_001156e8:
    local_178 = dVar22 - dVar16;
  }
  if (dVar20 <= 3.14159265358979) {
    if (dVar20 < -3.14159265358979) {
      dVar16 = 6.28318530717959;
      goto LAB_0011572a;
    }
  }
  else {
    dVar16 = -6.28318530717959;
LAB_0011572a:
    local_168 = dVar20 + dVar16;
  }
  local_f8._0_8_ = (ulong)((double)local_f8._0_8_ - local_110) & (ulong)DAT_00132070;
  local_f8._8_8_ = local_f8._8_8_ & DAT_00132070._8_8_;
  local_108._0_8_ = (ulong)((double)local_108._0_8_ - (double)local_1b8._0_8_) & (ulong)DAT_00132070
  ;
  local_108._8_8_ = local_108._8_8_ & DAT_00132070._8_8_;
  pdVar10 = &local_178;
  pdVar9 = &local_68;
  pdVar8 = local_78;
  uVar11 = '\0';
  uVar15 = CONCAT71((int7)((ulong)in_R10 >> 8),1);
  local_1a0 = CONCAT31((int3)((uint)in_R11D >> 8),1);
  bVar6 = true;
  do {
    bVar4 = bVar6;
    pdVar12 = &local_110;
    uVar13 = (uint)uVar15;
    if ((uVar15 & 1) != 0) {
      this->_ij0[0] = uVar11;
      this->_ij0[1] = 0xff;
      if ((((bVar4) && ((double)local_f8._0_8_ < 1e-06)) && ((local_1a0 & 1) != 0)) &&
         ((double)local_108._0_8_ < 1e-06)) {
        this->_ij0[1] = '\x01';
        uVar13 = 0;
        local_1a0 = 0;
      }
      local_15c = uVar13;
      this->j0 = *pdVar10;
      dVar16 = *pdVar9;
      this->cj0 = dVar16;
      dVar20 = *pdVar8;
      this->sj0 = dVar20;
      this->_nj2 = '\x02';
      dVar16 = dVar16 * 0.0864856630609769 * this->px +
               this->py * 0.0864856630609769 * dVar20 +
               this->pp * -1.72971326121954 + 1.00223910638213;
      if (ABS(dVar16) <= 1.0000001) {
        dVar20 = IKasin(dVar16);
        dVar16 = -1.50293950393859 - dVar20;
        local_188[0] = dVar16;
        local_98[0] = sin(dVar16);
        local_d8._0_8_ = local_98[0];
        local_d8._8_8_ = extraout_XMM0_Qb_01;
        local_c8 = cos(dVar16);
        dVar20 = dVar20 + 1.6386531496512;
        local_1c0 = dVar20;
        uStack_c0 = extraout_XMM0_Qb_02;
        local_88[0] = local_c8;
        local_58 = sin(dVar20);
        local_1b8._0_8_ = local_58;
        local_50 = cos(dVar20);
        if (dVar16 <= 3.14159265358979) {
          if (dVar16 < -3.14159265358979) {
            local_188[0] = dVar16 + 6.28318530717959;
            goto LAB_001159b0;
          }
        }
        else {
          local_188[0] = dVar16 + -6.28318530717959;
LAB_001159b0:
        }
        dVar16 = -6.28318530717959;
        if ((3.14159265358979 < dVar20) || (dVar16 = 6.28318530717959, dVar20 < -3.14159265358979))
        {
          local_1c0 = dVar20 + dVar16;
        }
        local_c8 = (double)((ulong)(local_c8 - local_50) & (ulong)DAT_00132070);
        uStack_c0 = uStack_c0 & DAT_00132070._8_8_;
        local_d8._0_8_ =
             (ulong)((double)local_d8._0_8_ - (double)local_1b8._0_8_) & (ulong)DAT_00132070;
        local_d8._8_8_ = local_d8._8_8_ & DAT_00132070._8_8_;
        uVar11 = '\0';
        bVar14 = true;
        pdVar10 = local_188;
        local_19c = (uint)CONCAT71((int7)((ulong)pdVar12 >> 8),1);
        pdVar9 = local_98;
        pdVar8 = local_88;
        bVar6 = true;
        do {
          bVar5 = bVar6;
          if (bVar14) {
            this->_ij2[0] = uVar11;
            this->_ij2[1] = 0xff;
            if (((bVar5) && (local_c8 < 1e-06)) &&
               (((local_19c & 1) != 0 && ((double)local_d8._0_8_ < 1e-06)))) {
              this->_ij2[1] = '\x01';
              bVar14 = false;
              local_19c = 0;
            }
            this->j2 = *pdVar10;
            dVar16 = *pdVar8;
            this->cj2 = dVar16;
            dStack_b0 = *pdVar9;
            this->sj2 = dStack_b0;
            local_a8 = this->cj0;
            dVar20 = this->px;
            local_b8 = dVar16;
            dVar33 = dVar16 * dVar16;
            dVar35 = dVar16 * dStack_b0;
            local_198._0_8_ = dStack_b0 * 0.515;
            local_198._8_8_ = 0;
            local_170 = this->py;
            dVar36 = this->sj0 * local_170;
            dVar22 = this->pz;
            dVar34 = dVar16 * dVar22;
            dVar37 = dStack_b0 * dVar22;
            uStack_a0 = 0;
            dStack_130 = 0.0;
            dVar25 = dVar20 * local_a8;
            dVar32 = dVar16 * 0.035;
            uVar30 = SUB84(dVar36,0);
            local_48._8_4_ = uVar30;
            local_48._0_8_ = dVar25;
            local_48._12_4_ = (int)((ulong)dVar36 >> 0x20);
            dVar17 = -dVar25;
            dVar23 = -dVar36;
            uVar31 = (undefined4)((ulong)dVar23 >> 0x20);
            local_1b8._8_8_ = 0;
            local_1b8._0_8_ = dVar37;
            local_138 = dVar20;
            if (((ABS(ABS(dVar22 * -0.025 +
                          dVar25 * dVar22 +
                          dVar36 * dVar22 +
                          dVar35 * 0.264 +
                          dVar16 * -0.0196 + dVar33 * -0.03605 + dStack_b0 * 0.2884 + 0.018025) +
                      ABS(dVar35 * 0.03605 + dVar33 * 0.264 + dVar22 * dVar22 + -0.265225)) < 1e-06)
                || (uStack_140 = 0,
                   ABS(dVar37 * 40.0 +
                       dStack_b0 * 588.571428571429 * dVar36 +
                       dVar16 * 40.0 * dVar23 +
                       dVar34 * 588.571428571429 +
                       dStack_b0 * -14.7142857142857 +
                       dVar25 * dStack_b0 * 588.571428571429 +
                       dVar17 * dVar16 * 40.0 + dVar22 * 640.0 + dVar16) < 1e-06)) ||
               (dVar16 * 0.000875 +
                dVar23 * dVar32 +
                dVar25 * (double)local_198._0_8_ +
                dVar34 * 0.515 +
                dVar37 * 0.035 + dStack_b0 * -0.012875 + dVar17 * dVar32 + dVar22 * 0.56 +
                (double)local_198._0_8_ * dVar36 == 0.0)) {
              local_158._8_4_ = uVar30;
              local_158._0_8_ = dVar17;
              local_158._12_4_ = uVar31;
              local_148 = dStack_b0 * 0.035;
              uStack_140 = 0;
              dVar38 = dVar16 * 0.515;
              dVar41 = dVar23 * dVar38;
              local_1b8._8_4_ = uVar30;
              local_1b8._0_8_ = dVar23;
              local_1b8._12_4_ = uVar31;
              dVar40 = dVar23 * local_148;
              if (1e-06 <= ABS(dVar16 * 588.571428571429 * dVar17 +
                               dVar37 * 588.571428571429 +
                               dVar25 * -640.0 +
                               dVar36 * -640.0 +
                               ((dVar34 * -40.0 +
                                dVar16 * 14.7142857142857 +
                                dVar23 * dStack_b0 * 40.0 +
                                dVar23 * dVar16 * 588.571428571429 + dStack_b0 + 16.0) -
                               dStack_b0 * 40.0 * dVar25))) {
                local_60 = dVar25 * -0.56;
                local_e8._8_8_ = 0;
                local_e8._0_8_ = dVar36 * -0.56;
                if (dVar17 * local_148 +
                    dStack_b0 * 0.000875 +
                    dVar34 * -0.035 +
                    dVar16 * 0.012875 +
                    dVar37 * 0.515 + 0.014 + dVar41 + dVar40 + dVar25 * -0.56 + dVar36 * -0.56 +
                    dVar17 * dVar38 != 0.0) {
                  this->_nj1 = '\x01';
                  dVar36 = dVar16 * -0.0196 +
                           dVar35 * 0.264 +
                           dVar33 * -0.03605 +
                           dStack_b0 * 0.2884 +
                           dVar22 * dVar17 + dVar22 * 0.025 + dVar23 * dVar22 + 0.018025;
                  dVar16 = dStack_b0 * -0.0392 +
                           dVar16 * -0.5768 +
                           dVar22 * dVar22 + dVar33 * -0.264 + dVar35 * -0.03605 + -0.314825;
                  if (NAN(dVar36) || NAN(dVar16)) goto LAB_001167c5;
                  if ((1e-07 < ABS(dVar16)) || (1e-07 <= ABS(dVar36))) {
                    local_1b8._8_8_ = dVar23;
                    local_1b8._0_8_ = dVar40;
                    local_198._8_8_ = 0;
                    local_198._0_8_ = dVar41;
                    dVar20 = atan2(dVar36,dVar16);
                    dVar16 = (double)local_e8._0_8_ +
                             local_60 +
                             this->sj2 * 0.000875 +
                             ((this->cj2 * 0.012875 +
                              this->pz * 0.515 * this->sj2 +
                              this->cj2 * -0.035 * this->pz +
                              dVar17 * dVar38 +
                              (double)local_1b8._0_8_ + (double)local_198._0_8_ + 0.014) -
                             local_148 * dVar25);
                    uVar15 = -(ulong)(0.0 < dVar16);
                    dVar16 = (double)(uVar15 & 0x3ff0000000000000 |
                                     ~uVar15 & -(ulong)(dVar16 < 0.0) & 0xbff0000000000000);
                    if ((dVar16 != 0.0) || (NAN(dVar16))) {
                      dVar22 = (1.0 / dVar16) * 1.5707963267949 + dVar20 + -1.5707963267949;
                      dVar16 = sin(dVar22);
                      dVar20 = cos(dVar22);
                      if (dVar22 <= 3.14159265358979) {
                        if (dVar22 < -3.14159265358979) {
                          dVar22 = dVar22 + 6.28318530717959;
                        }
                      }
                      else {
                        dVar22 = dVar22 + -6.28318530717959;
                      }
                      this->_ij1[0] = '\0';
                      this->_ij1[1] = 0xff;
                      this->j1 = dVar22;
                      this->cj1 = dVar20;
                      this->sj1 = dVar16;
                      dVar20 = sin(dVar22);
                      dVar22 = cos(this->j1);
                      dVar17 = this->cj0 * this->px;
                      dVar25 = this->py * this->sj0;
                      dVar23 = this->sj2 * 0.515;
                      dVar16 = this->pz;
                      dVar36 = this->cj2 * 0.035;
                      if (ABS(dVar20 * -0.025 +
                              (((dVar20 * dVar25 + dVar20 * dVar17) - dVar36) - dVar22 * dVar16) +
                              dVar23) <= 1e-05) {
                        dVar33 = this->sj2 * 0.035;
                        dVar32 = this->cj2 * 0.515;
                        auVar21._4_4_ =
                             -(uint)(DAT_00132130._8_8_ <
                                    ABS(dVar36 * -dVar22 +
                                        dVar16 * -1.0 +
                                        dVar20 * dVar32 + dVar20 * 0.56 + dVar20 * dVar33 +
                                        dVar23 * dVar22));
                        auVar21._0_4_ =
                             -(uint)((double)DAT_00132130 <
                                    ABS(((dVar22 * 0.025 + (0.56 - dVar17 * dVar22)) -
                                        dVar25 * dVar22) + dVar33 + dVar32 + dVar16 * -dVar20));
                        auVar21._8_4_ =
                             -(uint)((double)DAT_00132130 <
                                    ABS(dVar17 * dVar22 * 1.12 +
                                        this->pp * -1.0 +
                                        dVar22 * 1.12 * dVar25 +
                                        dVar20 * dVar16 * 1.12 +
                                        dVar22 * -0.028 + dVar17 * 0.05 + dVar25 * 0.05 + -0.047775)
                                    );
                        auVar21._12_4_ =
                             -(uint)(DAT_00132130._8_8_ <
                                    ABS(dVar22 * dVar33 +
                                        dVar22 * dVar32 +
                                        ((((dVar22 * 0.56 + dVar20 * dVar36 + 0.025) -
                                          dVar20 * dVar23) - dVar17) - dVar25)));
                        iVar7 = movmskps(extraout_EAX_00,auVar21);
                        goto joined_r0x00116e34;
                      }
                    }
                  }
                  goto LAB_00116e43;
                }
              }
              local_1b8._8_8_ = 0;
              local_1b8._0_8_ = dVar16;
              dVar33 = local_a8 * local_a8;
              dVar35 = local_170 * local_170;
              dVar23 = dVar20 * dVar20 * dVar33;
              local_138 = dVar36 * 0.05;
              if (1e-06 <= ABS((dVar22 * dVar22 * -1600.0 +
                               dVar23 * -1600.0 +
                               dVar25 * 80.0 +
                               dVar36 * 80.0 +
                               dVar25 * -3200.0 * dVar36 + dVar33 * dVar35 * 1600.0 + -1.0) -
                               dVar35 * 1600.0)) {
                dVar36 = dVar25 * -2.0 * dVar36;
                auVar29._0_8_ = dVar33 * dVar35;
                auVar29._8_8_ = 0;
                if ((((local_138 + -0.000625 + dVar25 * 0.05 + dVar36 + auVar29._0_8_) -
                     dVar22 * dVar22) - dVar23) - dVar35 != 0.0) {
                  local_e8 = auVar29;
                  local_b8 = dVar25 * 0.05;
                  dStack_130 = 0.0;
                  dVar23 = -dVar22;
                  this->_nj1 = '\x01';
                  dVar20 = (double)local_198._0_8_ * dVar23 +
                           dVar25 * -0.56 +
                           (double)local_48._8_8_ * -0.56 +
                           dVar38 * dVar17 +
                           local_148 * dVar17 +
                           dStack_b0 * 0.000875 +
                           dVar32 * dVar22 + dVar16 * 0.012875 + dVar40 + dVar41 + 0.014;
                  dVar16 = dVar16 * 0.000875 +
                           dVar17 * dVar32 +
                           (double)local_198._0_8_ * dVar25 +
                           dVar32 * (double)local_158._8_8_ +
                           dVar22 * -0.56 +
                           (double)local_48._8_8_ * (double)local_198._0_8_ +
                           dStack_b0 * -0.012875 + local_148 * dVar23 + dVar38 * dVar23;
                  if ((!NAN(dVar16) && !NAN(dVar20)) &&
                     ((1e-07 <= ABS(dVar16) || (1e-07 < ABS(dVar20))))) {
                    uStack_a0 = 0;
                    local_170 = dVar35;
                    local_a8 = dVar33;
                    dVar20 = atan2(dVar16,dVar20);
                    dVar16 = (((dVar36 + (double)local_e8._0_8_ + local_138 + local_b8 + -0.000625)
                              - local_170) - this->pz * this->pz) - local_a8 * this->px * this->px;
                    uVar15 = -(ulong)(0.0 < dVar16);
                    dVar16 = (double)(uVar15 & 0x3ff0000000000000 |
                                     ~uVar15 & -(ulong)(dVar16 < 0.0) & 0xbff0000000000000);
                    if ((dVar16 != 0.0) || (NAN(dVar16))) {
                      dVar22 = (1.0 / dVar16) * 1.5707963267949 + dVar20 + -1.5707963267949;
                      dVar16 = sin(dVar22);
                      dVar20 = cos(dVar22);
                      if (dVar22 <= 3.14159265358979) {
                        if (dVar22 < -3.14159265358979) {
                          dVar22 = dVar22 + 6.28318530717959;
                        }
                      }
                      else {
                        dVar22 = dVar22 + -6.28318530717959;
                      }
                      this->_ij1[0] = '\0';
                      this->_ij1[1] = 0xff;
                      this->j1 = dVar22;
                      this->cj1 = dVar20;
                      this->sj1 = dVar16;
                      dVar20 = sin(dVar22);
                      dVar22 = cos(this->j1);
                      dVar17 = this->cj0 * this->px;
                      uVar1 = this->cj2;
                      uVar2 = this->sj2;
                      dVar25 = (double)uVar2 * 0.515;
                      dVar16 = this->pz;
                      dVar23 = this->sj0 * this->py;
                      dVar36 = (double)uVar1 * 0.035;
                      if (ABS((dVar20 * -0.025 +
                              ((dVar17 * dVar20 + dVar20 * dVar23) - dVar36) + dVar25) -
                              dVar16 * dVar22) <= 1e-05) {
                        dVar32 = (double)uVar1 * 0.515;
                        dVar33 = (double)uVar2 * 0.035;
                        auVar19._4_4_ =
                             -(uint)(1e-05 < ABS(dVar20 * 0.56 +
                                                 ((dVar32 * dVar20 +
                                                  dVar16 * -1.0 + dVar20 * dVar33 + dVar22 * dVar25)
                                                 - dVar22 * dVar36)));
                        auVar19._0_4_ =
                             -(uint)(1e-05 < ABS(dVar20 * -dVar16 +
                                                 ((dVar22 * 0.025 + (0.56 - dVar17 * dVar22) +
                                                   dVar33 + dVar32) - dVar22 * dVar23)));
                        auVar19._8_4_ =
                             -(uint)(1e-05 < ABS(dVar22 * 1.12 * dVar17 +
                                                 dVar17 * 0.05 +
                                                 dVar23 * 0.05 +
                                                 dVar20 * dVar16 * 1.12 +
                                                 dVar22 * -0.028 +
                                                 ((dVar23 * dVar22 * 1.12 + -0.047775) - this->pp)))
                        ;
                        auVar19._12_4_ =
                             -(uint)(1e-05 < ABS(dVar17 * -1.0 +
                                                 dVar23 * -1.0 +
                                                 dVar36 * dVar20 +
                                                 dVar22 * dVar32 +
                                                 ((dVar22 * 0.56 + dVar33 * dVar22 + 0.025) -
                                                 dVar25 * dVar20)));
                        iVar7 = movmskps(extraout_EAX_01,auVar19);
                        goto joined_r0x00116e34;
                      }
                    }
                  }
                  goto LAB_00116e43;
                }
              }
            }
            else {
              this->_nj1 = '\x01';
              dVar16 = dVar22 * -0.025 +
                       dVar35 * 0.264 +
                       dVar33 * -0.03605 +
                       dVar16 * -0.0196 +
                       dStack_b0 * 0.2884 + dVar22 * dVar36 + dVar22 * dVar25 + 0.018025;
              dVar22 = dVar33 * 0.264 + dVar22 * dVar22 + dVar35 * 0.03605 + -0.265225;
              local_148 = dVar34;
              if (!NAN(dVar22) && !NAN(dVar16)) {
                if ((1e-07 <= ABS(dVar22)) || (1e-07 < ABS(dVar16))) {
                  local_158._8_4_ = uVar30;
                  local_158._0_8_ = dVar17;
                  local_158._12_4_ = uVar31;
                  local_1b8._8_8_ = 0;
                  local_1b8._0_8_ = (double)local_198._0_8_ * dVar36;
                  local_138 = dVar32;
                  dStack_130 = dVar32;
                  dVar20 = atan2(dVar22,dVar16);
                  dVar16 = this->pz;
                  dVar16 = (this->cj2 * 0.000875 +
                           dVar16 * 0.035 * this->sj2 +
                           (double)local_198._0_8_ * dVar25 +
                           this->cj2 * 0.515 * dVar16 +
                           (double)local_1b8._0_8_ +
                           (double)local_158._0_8_ * local_138 +
                           dVar16 * 0.56 + this->sj2 * -0.012875) - dVar36 * local_138;
                  uVar15 = -(ulong)(0.0 < dVar16);
                  dVar16 = (double)(uVar15 & 0x3ff0000000000000 |
                                   ~uVar15 & -(ulong)(dVar16 < 0.0) & 0xbff0000000000000);
                  if ((dVar16 != 0.0) || (NAN(dVar16))) {
                    dVar22 = (1.0 / dVar16) * 1.5707963267949 + dVar20 + -1.5707963267949;
                    dVar16 = sin(dVar22);
                    dVar20 = cos(dVar22);
                    if (dVar22 <= 3.14159265358979) {
                      if (dVar22 < -3.14159265358979) {
                        dVar22 = dVar22 + 6.28318530717959;
                      }
                    }
                    else {
                      dVar22 = dVar22 + -6.28318530717959;
                    }
                    this->_ij1[0] = '\0';
                    this->_ij1[1] = 0xff;
                    this->j1 = dVar22;
                    this->cj1 = dVar20;
                    this->sj1 = dVar16;
                    dVar22 = sin(dVar22);
                    dVar17 = cos(this->j1);
                    dVar25 = this->cj0 * this->px;
                    dVar36 = this->py * this->sj0;
                    dVar23 = this->sj2 * 0.515;
                    dVar16 = this->pz;
                    dVar20 = this->cj2 * 0.035;
                    if (ABS((((dVar22 * -0.025 + dVar22 * dVar36 + dVar22 * dVar25) -
                             dVar17 * dVar16) - dVar20) + dVar23) <= 1e-05) {
                      dVar32 = this->cj2 * 0.515;
                      dVar33 = this->sj2 * 0.035;
                      auVar24._4_4_ =
                           -(uint)(1e-05 < ABS(dVar16 * -1.0 +
                                               dVar20 * -dVar17 +
                                               dVar23 * dVar17 + dVar22 * dVar33 + dVar22 * dVar32 +
                                               dVar22 * 0.56));
                      auVar24._0_4_ =
                           -(uint)(1e-05 < ABS(((dVar17 * 0.025 + (0.56 - dVar25 * dVar17)) -
                                               dVar36 * dVar17) + dVar33 + dVar32 + dVar16 * -dVar22
                                              ));
                      auVar24._8_4_ =
                           -(uint)(1e-05 < ABS(dVar25 * 0.05 +
                                               dVar22 * dVar16 * 1.12 +
                                               this->pp * -1.0 +
                                               dVar25 * dVar17 * 1.12 +
                                               dVar17 * 1.12 * dVar36 + dVar17 * -0.028 + -0.047775
                                               + dVar36 * 0.05));
                      auVar24._12_4_ =
                           -(uint)(1e-05 < ABS(dVar17 * 0.56 +
                                               dVar17 * dVar32 +
                                               dVar17 * dVar33 +
                                               (((dVar22 * dVar20 + 0.025) - dVar25) - dVar36) +
                                               dVar23 * -dVar22));
                      iVar7 = movmskps(extraout_EAX,auVar24);
joined_r0x00116e34:
                      if (iVar7 == 0) {
                        rotationfunction0(this,local_120);
                      }
                    }
                  }
                }
                goto LAB_00116e43;
              }
            }
LAB_001167c5:
            uStack_140 = 0;
            local_138 = dVar20;
          }
LAB_00116e43:
          pdVar10 = &local_1c0;
          uVar11 = '\x01';
          pdVar9 = &local_58;
          pdVar8 = &local_50;
          bVar6 = false;
        } while (bVar5);
      }
      uVar15 = (ulong)local_15c;
    }
    pdVar8 = &local_118;
    pdVar9 = &local_110;
    pdVar10 = &local_168;
    uVar11 = '\x01';
    solutions = local_120;
    bVar6 = false;
  } while (bVar4);
LAB_001155f3:
  iVar7 = (*solutions->_vptr_IkSolutionListBase[4])(solutions);
  return CONCAT44(extraout_var,iVar7) != 0;
}

Assistant:

bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
j0=numeric_limits<IkReal>::quiet_NaN(); _ij0[0] = -1; _ij0[1] = -1; _nj0 = -1; j1=numeric_limits<IkReal>::quiet_NaN(); _ij1[0] = -1; _ij1[1] = -1; _nj1 = -1; j2=numeric_limits<IkReal>::quiet_NaN(); _ij2[0] = -1; _ij2[1] = -1; _nj2 = -1; j3=numeric_limits<IkReal>::quiet_NaN(); _ij3[0] = -1; _ij3[1] = -1; _nj3 = -1; j4=numeric_limits<IkReal>::quiet_NaN(); _ij4[0] = -1; _ij4[1] = -1; _nj4 = -1; j5=numeric_limits<IkReal>::quiet_NaN(); _ij5[0] = -1; _ij5[1] = -1; _nj5 = -1; 
for(int dummyiter = 0; dummyiter < 1; ++dummyiter) {
    solutions.Clear();
r00 = eerot[0*3+0];
r01 = eerot[0*3+1];
r02 = eerot[0*3+2];
r10 = eerot[1*3+0];
r11 = eerot[1*3+1];
r12 = eerot[1*3+2];
r20 = eerot[2*3+0];
r21 = eerot[2*3+1];
r22 = eerot[2*3+2];
px = eetrans[0]; py = eetrans[1]; pz = eetrans[2];

new_r00=r02;
new_r01=r01;
new_r02=((-1.0)*r00);
new_px=((((-0.08)*r00))+px);
new_r10=((-1.0)*r12);
new_r11=((-1.0)*r11);
new_r12=r10;
new_py=((((-1.0)*py))+(((0.08)*r10)));
new_r20=((-1.0)*r22);
new_r21=((-1.0)*r21);
new_r22=r20;
new_pz=((0.4)+(((-1.0)*pz))+(((0.08)*r20)));
r00 = new_r00; r01 = new_r01; r02 = new_r02; r10 = new_r10; r11 = new_r11; r12 = new_r12; r20 = new_r20; r21 = new_r21; r22 = new_r22; px = new_px; py = new_py; pz = new_pz;
IkReal x54=((1.0)*px);
IkReal x55=((1.0)*pz);
IkReal x56=((1.0)*py);
pp=((px*px)+(py*py)+(pz*pz));
npx=(((px*r00))+((py*r10))+((pz*r20)));
npy=(((px*r01))+((py*r11))+((pz*r21)));
npz=(((px*r02))+((py*r12))+((pz*r22)));
rxp0_0=((((-1.0)*r20*x56))+((pz*r10)));
rxp0_1=(((px*r20))+(((-1.0)*r00*x55)));
rxp0_2=((((-1.0)*r10*x54))+((py*r00)));
rxp1_0=((((-1.0)*r21*x56))+((pz*r11)));
rxp1_1=(((px*r21))+(((-1.0)*r01*x55)));
rxp1_2=((((-1.0)*r11*x54))+((py*r01)));
rxp2_0=(((pz*r12))+(((-1.0)*r22*x56)));
rxp2_1=(((px*r22))+(((-1.0)*r02*x55)));
rxp2_2=((((-1.0)*r12*x54))+((py*r02)));
{
IkReal j0eval[1];
j0eval[0]=((IKabs(px))+(IKabs(py)));
if( IKabs(j0eval[0]) < 0.0000010000000000  )
{
continue; // no branches [j0, j1, j2]

} else
{
{
IkReal j0array[2], cj0array[2], sj0array[2];
bool j0valid[2]={false};
_nj0 = 2;
CheckValue<IkReal> x58 = IKatan2WithCheck(IkReal(py),IkReal(((-1.0)*px)),IKFAST_ATAN2_MAGTHRESH);
if(!x58.valid){
continue;
}
IkReal x57=x58.value;
j0array[0]=((-1.0)*x57);
sj0array[0]=IKsin(j0array[0]);
cj0array[0]=IKcos(j0array[0]);
j0array[1]=((3.14159265358979)+(((-1.0)*x57)));
sj0array[1]=IKsin(j0array[1]);
cj0array[1]=IKcos(j0array[1]);
if( j0array[0] > IKPI )
{
    j0array[0]-=IK2PI;
}
else if( j0array[0] < -IKPI )
{    j0array[0]+=IK2PI;
}
j0valid[0] = true;
if( j0array[1] > IKPI )
{
    j0array[1]-=IK2PI;
}
else if( j0array[1] < -IKPI )
{    j0array[1]+=IK2PI;
}
j0valid[1] = true;
for(int ij0 = 0; ij0 < 2; ++ij0)
{
if( !j0valid[ij0] )
{
    continue;
}
_ij0[0] = ij0; _ij0[1] = -1;
for(int iij0 = ij0+1; iij0 < 2; ++iij0)
{
if( j0valid[iij0] && IKabs(cj0array[ij0]-cj0array[iij0]) < IKFAST_SOLUTION_THRESH && IKabs(sj0array[ij0]-sj0array[iij0]) < IKFAST_SOLUTION_THRESH )
{
    j0valid[iij0]=false; _ij0[1] = iij0; break; 
}
}
j0 = j0array[ij0]; cj0 = cj0array[ij0]; sj0 = sj0array[ij0];

{
IkReal j2array[2], cj2array[2], sj2array[2];
bool j2valid[2]={false};
_nj2 = 2;
if( (((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px)))) < -1-IKFAST_SINCOS_THRESH || (((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px)))) > 1+IKFAST_SINCOS_THRESH )
    continue;
IkReal x59=IKasin(((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px))));
j2array[0]=((-1.50293950393859)+(((-1.0)*x59)));
sj2array[0]=IKsin(j2array[0]);
cj2array[0]=IKcos(j2array[0]);
j2array[1]=((1.6386531496512)+x59);
sj2array[1]=IKsin(j2array[1]);
cj2array[1]=IKcos(j2array[1]);
if( j2array[0] > IKPI )
{
    j2array[0]-=IK2PI;
}
else if( j2array[0] < -IKPI )
{    j2array[0]+=IK2PI;
}
j2valid[0] = true;
if( j2array[1] > IKPI )
{
    j2array[1]-=IK2PI;
}
else if( j2array[1] < -IKPI )
{    j2array[1]+=IK2PI;
}
j2valid[1] = true;
for(int ij2 = 0; ij2 < 2; ++ij2)
{
if( !j2valid[ij2] )
{
    continue;
}
_ij2[0] = ij2; _ij2[1] = -1;
for(int iij2 = ij2+1; iij2 < 2; ++iij2)
{
if( j2valid[iij2] && IKabs(cj2array[ij2]-cj2array[iij2]) < IKFAST_SOLUTION_THRESH && IKabs(sj2array[ij2]-sj2array[iij2]) < IKFAST_SOLUTION_THRESH )
{
    j2valid[iij2]=false; _ij2[1] = iij2; break; 
}
}
j2 = j2array[ij2]; cj2 = cj2array[ij2]; sj2 = sj2array[ij2];

{
IkReal j1eval[3];
IkReal x60=cj2*cj2;
IkReal x61=(cj0*px);
IkReal x62=(cj2*sj2);
IkReal x63=((0.515)*sj2);
IkReal x64=(py*sj0);
IkReal x65=((40.0)*cj2);
IkReal x66=((0.035)*cj2);
IkReal x67=((588.571428571429)*sj2);
IkReal x68=(cj2*pz);
IkReal x69=(pz*sj2);
j1eval[0]=((((-1.0)*x61*x65))+(((640.0)*pz))+cj2+((x61*x67))+(((-14.7142857142857)*sj2))+(((588.571428571429)*x68))+(((-1.0)*x64*x65))+((x64*x67))+(((40.0)*x69)));
j1eval[1]=IKsign(((((-1.0)*x61*x66))+(((0.56)*pz))+(((-0.012875)*sj2))+(((0.035)*x69))+(((0.515)*x68))+((x61*x63))+(((-1.0)*x64*x66))+((x63*x64))+(((0.000875)*cj2))));
j1eval[2]=((IKabs(((-0.265225)+(pz*pz)+(((0.264)*x60))+(((0.03605)*x62)))))+(IKabs(((0.018025)+(((0.2884)*sj2))+(((-0.03605)*x60))+(((-0.0196)*cj2))+(((0.264)*x62))+((pz*x64))+((pz*x61))+(((-0.025)*pz))))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  || IKabs(j1eval[2]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x70=(py*sj0);
IkReal x71=((40.0)*sj2);
IkReal x72=(cj0*px);
IkReal x73=(cj2*pz);
IkReal x74=((0.035)*sj2);
IkReal x75=(pz*sj2);
IkReal x76=((588.571428571429)*cj2);
IkReal x77=((0.515)*cj2);
j1eval[0]=((16.0)+sj2+(((-1.0)*x70*x76))+(((-1.0)*x70*x71))+(((14.7142857142857)*cj2))+(((-40.0)*x73))+(((-1.0)*x71*x72))+(((-640.0)*x70))+(((-640.0)*x72))+(((588.571428571429)*x75))+(((-1.0)*x72*x76)));
j1eval[1]=IKsign(((0.014)+(((0.515)*x75))+(((-1.0)*x70*x77))+(((-1.0)*x70*x74))+(((-0.56)*x72))+(((-0.56)*x70))+(((0.012875)*cj2))+(((-0.035)*x73))+(((0.000875)*sj2))+(((-1.0)*x72*x74))+(((-1.0)*x72*x77))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x78=cj0*cj0;
IkReal x79=py*py;
IkReal x80=px*px;
IkReal x81=pz*pz;
IkReal x82=(cj0*px);
IkReal x83=(py*sj0);
IkReal x84=((1600.0)*x79);
IkReal x85=(x78*x80);
j1eval[0]=((-1.0)+((x78*x84))+(((-3200.0)*x82*x83))+(((80.0)*x83))+(((80.0)*x82))+(((-1600.0)*x85))+(((-1600.0)*x81))+(((-1.0)*x84)));
j1eval[1]=IKsign(((-0.000625)+(((0.05)*x83))+(((0.05)*x82))+(((-2.0)*x82*x83))+((x78*x79))+(((-1.0)*x81))+(((-1.0)*x85))+(((-1.0)*x79))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
continue; // no branches [j1]

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x86=py*py;
IkReal x87=cj0*cj0;
IkReal x88=(cj0*px);
IkReal x89=((0.515)*sj2);
IkReal x90=(py*sj0);
IkReal x91=((0.035)*cj2);
IkReal x92=((0.035)*sj2);
IkReal x93=((0.515)*cj2);
IkReal x94=(sj2*x90);
CheckValue<IkReal> x95 = IKatan2WithCheck(IkReal(((((-1.0)*pz*x92))+(((-1.0)*pz*x93))+(((-0.012875)*sj2))+((x89*x90))+(((-0.56)*pz))+(((-1.0)*x90*x91))+((x88*x89))+(((-1.0)*x88*x91))+(((0.000875)*cj2)))),IkReal(((0.014)+(((-1.0)*x90*x93))+(((-1.0)*x90*x92))+(((0.012875)*cj2))+((pz*x91))+(((0.000875)*sj2))+(((-1.0)*x88*x92))+(((-1.0)*x88*x93))+(((-0.56)*x90))+(((-0.56)*x88))+(((-1.0)*pz*x89)))),IKFAST_ATAN2_MAGTHRESH);
if(!x95.valid){
continue;
}
CheckValue<IkReal> x96=IKPowWithIntegerCheck(IKsign(((-0.000625)+(((0.05)*x88))+(((0.05)*x90))+((x86*x87))+(((-2.0)*x88*x90))+(((-1.0)*x86))+(((-1.0)*(pz*pz)))+(((-1.0)*x87*(px*px))))),-1);
if(!x96.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x95.value)+(((1.5707963267949)*(x96.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x97=IKsin(j1);
IkReal x98=IKcos(j1);
IkReal x99=((0.515)*cj2);
IkReal x100=(cj0*px);
IkReal x101=((0.515)*sj2);
IkReal x102=((0.035)*sj2);
IkReal x103=(py*sj0);
IkReal x104=((1.0)*pz);
IkReal x105=((0.035)*cj2);
IkReal x106=((1.0)*x98);
IkReal x107=((1.12)*x98);
evalcond[0]=(((x100*x97))+((x103*x97))+(((-1.0)*x105))+x101+(((-0.025)*x97))+(((-1.0)*x104*x98)));
evalcond[1]=((0.56)+(((-1.0)*x100*x106))+(((0.025)*x98))+x102+x99+(((-1.0)*x103*x106))+(((-1.0)*x104*x97)));
evalcond[2]=(((x102*x97))+((x101*x98))+(((-1.0)*x104))+((x97*x99))+(((-1.0)*x105*x98))+(((0.56)*x97)));
evalcond[3]=((-0.047775)+((x103*x107))+(((-1.0)*pp))+(((-0.028)*x98))+(((1.12)*pz*x97))+(((0.05)*x103))+(((0.05)*x100))+((x100*x107)));
evalcond[4]=((0.025)+((x102*x98))+(((0.56)*x98))+(((-1.0)*x101*x97))+((x98*x99))+((x105*x97))+(((-1.0)*x103))+(((-1.0)*x100)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x610=cj2*cj2;
IkReal x611=(cj2*sj2);
IkReal x612=(py*sj0);
IkReal x613=((0.035)*sj2);
IkReal x614=(cj0*px);
IkReal x615=((1.0)*pz);
IkReal x616=((0.515)*cj2);
CheckValue<IkReal> x617 = IKatan2WithCheck(IkReal(((0.018025)+(((-1.0)*x612*x615))+(((0.025)*pz))+(((-1.0)*x614*x615))+(((0.2884)*sj2))+(((-0.03605)*x610))+(((0.264)*x611))+(((-0.0196)*cj2)))),IkReal(((-0.314825)+(((-0.03605)*x611))+(((-0.264)*x610))+(pz*pz)+(((-0.5768)*cj2))+(((-0.0392)*sj2)))),IKFAST_ATAN2_MAGTHRESH);
if(!x617.valid){
continue;
}
CheckValue<IkReal> x618=IKPowWithIntegerCheck(IKsign(((0.014)+(((-1.0)*x612*x616))+(((-1.0)*x612*x613))+(((-1.0)*x614*x616))+(((-0.035)*cj2*pz))+(((0.515)*pz*sj2))+(((0.012875)*cj2))+(((-1.0)*x613*x614))+(((0.000875)*sj2))+(((-0.56)*x614))+(((-0.56)*x612)))),-1);
if(!x618.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x617.value)+(((1.5707963267949)*(x618.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x619=IKsin(j1);
IkReal x620=IKcos(j1);
IkReal x621=((0.515)*cj2);
IkReal x622=(cj0*px);
IkReal x623=((0.515)*sj2);
IkReal x624=((0.035)*sj2);
IkReal x625=(py*sj0);
IkReal x626=((1.0)*pz);
IkReal x627=((0.035)*cj2);
IkReal x628=((1.0)*x620);
IkReal x629=((1.12)*x620);
evalcond[0]=(((x619*x625))+((x619*x622))+(((-1.0)*x627))+(((-1.0)*x620*x626))+(((-0.025)*x619))+x623);
evalcond[1]=((0.56)+(((-1.0)*x622*x628))+(((0.025)*x620))+(((-1.0)*x625*x628))+x624+x621+(((-1.0)*x619*x626)));
evalcond[2]=((((0.56)*x619))+((x619*x624))+((x619*x621))+(((-1.0)*x626))+(((-1.0)*x620*x627))+((x620*x623)));
evalcond[3]=((-0.047775)+(((0.05)*x625))+(((0.05)*x622))+(((-0.028)*x620))+(((1.12)*pz*x619))+((x625*x629))+(((-1.0)*pp))+((x622*x629)));
evalcond[4]=((0.025)+((x619*x627))+(((0.56)*x620))+(((-1.0)*x619*x623))+(((-1.0)*x622))+(((-1.0)*x625))+((x620*x621))+((x620*x624)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x630=cj2*cj2;
IkReal x631=(cj0*px);
IkReal x632=((0.035)*cj2);
IkReal x633=(cj2*sj2);
IkReal x634=((0.515)*sj2);
IkReal x635=(py*sj0);
CheckValue<IkReal> x636 = IKatan2WithCheck(IkReal(((-0.265225)+(((0.03605)*x633))+(pz*pz)+(((0.264)*x630)))),IkReal(((0.018025)+((pz*x631))+((pz*x635))+(((0.2884)*sj2))+(((-0.0196)*cj2))+(((-0.03605)*x630))+(((0.264)*x633))+(((-0.025)*pz)))),IKFAST_ATAN2_MAGTHRESH);
if(!x636.valid){
continue;
}
CheckValue<IkReal> x637=IKPowWithIntegerCheck(IKsign(((((0.56)*pz))+(((-0.012875)*sj2))+(((-1.0)*x631*x632))+((x634*x635))+(((0.515)*cj2*pz))+((x631*x634))+(((0.035)*pz*sj2))+(((0.000875)*cj2))+(((-1.0)*x632*x635)))),-1);
if(!x637.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x636.value)+(((1.5707963267949)*(x637.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x638=IKsin(j1);
IkReal x639=IKcos(j1);
IkReal x640=((0.515)*cj2);
IkReal x641=(cj0*px);
IkReal x642=((0.515)*sj2);
IkReal x643=((0.035)*sj2);
IkReal x644=(py*sj0);
IkReal x645=((1.0)*pz);
IkReal x646=((0.035)*cj2);
IkReal x647=((1.0)*x639);
IkReal x648=((1.12)*x639);
evalcond[0]=(((x638*x644))+((x638*x641))+(((-0.025)*x638))+(((-1.0)*x639*x645))+(((-1.0)*x646))+x642);
evalcond[1]=((0.56)+(((-1.0)*x641*x647))+(((0.025)*x639))+(((-1.0)*x644*x647))+x643+x640+(((-1.0)*x638*x645)));
evalcond[2]=(((x638*x643))+((x638*x640))+((x639*x642))+(((-1.0)*x639*x646))+(((-1.0)*x645))+(((0.56)*x638)));
evalcond[3]=((-0.047775)+(((-0.028)*x639))+((x644*x648))+((x641*x648))+(((-1.0)*pp))+(((1.12)*pz*x638))+(((0.05)*x641))+(((0.05)*x644)));
evalcond[4]=((0.025)+((x638*x646))+(((-1.0)*x641))+(((-1.0)*x644))+((x639*x643))+((x639*x640))+(((0.56)*x639))+(((-1.0)*x638*x642)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}
}
}
}
}

}

}
}
return solutions.GetNumSolutions()>0;
}